

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_test.cc
# Opt level: O0

void __thiscall GraphTestNestedPhonyPrintsDone::Run(GraphTestNestedPhonyPrintsDone *this)

{
  Test *pTVar1;
  bool bVar2;
  int iVar3;
  Node *pNVar4;
  allocator<char> local_101;
  string local_100;
  undefined1 local_e0 [8];
  Plan plan_;
  allocator<char> local_59;
  string local_58;
  undefined1 local_38 [8];
  string err;
  GraphTestNestedPhonyPrintsDone *this_local;
  
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  AssertParse(&(this->super_GraphTest).super_StateTestWithBuiltinRules.state_,
              "build n1: phony \nbuild n2: phony n1\n",(ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_38);
  pTVar1 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"n2",&local_59);
  pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_58);
  bVar2 = DependencyScan::RecomputeDirty(&(this->super_GraphTest).scan_,pNVar4,(string *)local_38);
  testing::Test::Check
            (pTVar1,bVar2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
             ,0x13d,"scan_.RecomputeDirty(GetNode(\"n2\"), &err)");
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator(&local_59);
  pTVar1 = g_current_test;
  bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_38);
  bVar2 = testing::Test::Check
                    (pTVar1,bVar2,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                     ,0x13e,"\"\" == err");
  if (bVar2) {
    Plan::Plan((Plan *)local_e0,(Builder *)0x0);
    pTVar1 = g_current_test;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"n2",&local_101);
    pNVar4 = StateTestWithBuiltinRules::GetNode((StateTestWithBuiltinRules *)this,&local_100);
    bVar2 = Plan::AddTarget((Plan *)local_e0,pNVar4,(string *)local_38);
    testing::Test::Check
              (pTVar1,bVar2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
               ,0x141,"plan_.AddTarget(GetNode(\"n2\"), &err)");
    std::__cxx11::string::~string((string *)&local_100);
    std::allocator<char>::~allocator(&local_101);
    pTVar1 = g_current_test;
    bVar2 = std::operator==("",(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_38);
    bVar2 = testing::Test::Check
                      (pTVar1,bVar2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                       ,0x142,"\"\" == err");
    pTVar1 = g_current_test;
    if (bVar2) {
      iVar3 = Plan::command_edge_count((Plan *)local_e0);
      testing::Test::Check
                (pTVar1,iVar3 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                 ,0x144,"0 == plan_.command_edge_count()");
      pTVar1 = g_current_test;
      bVar2 = Plan::more_to_do((Plan *)local_e0);
      bVar2 = testing::Test::Check
                        (pTVar1,(bool)(~bVar2 & 1),
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/graph_test.cc"
                         ,0x145,"plan_.more_to_do()");
      if (bVar2) {
        plan_.command_edges_ = 0;
      }
      else {
        testing::Test::AddAssertionFailure(g_current_test);
        plan_.command_edges_ = 1;
      }
    }
    else {
      testing::Test::AddAssertionFailure(g_current_test);
      plan_.command_edges_ = 1;
    }
    Plan::~Plan((Plan *)local_e0);
  }
  else {
    testing::Test::AddAssertionFailure(g_current_test);
    plan_.command_edges_ = 1;
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

TEST_F(GraphTest, NestedPhonyPrintsDone) {
  AssertParse(&state_,
"build n1: phony \n"
"build n2: phony n1\n"
  );
  string err;
  EXPECT_TRUE(scan_.RecomputeDirty(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  Plan plan_;
  EXPECT_TRUE(plan_.AddTarget(GetNode("n2"), &err));
  ASSERT_EQ("", err);

  EXPECT_EQ(0, plan_.command_edge_count());
  ASSERT_FALSE(plan_.more_to_do());
}